

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

void al_destroy_bitmap(ALLEGRO_BITMAP *bitmap)

{
  _Bool _Var1;
  uint uVar2;
  ALLEGRO_BITMAP *pAVar3;
  ALLEGRO_DISPLAY *vec;
  ALLEGRO_BITMAP *in_RDI;
  ALLEGRO_DISPLAY *disp;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_DISPLAY *in_stack_ffffffffffffffd8;
  ALLEGRO_BITMAP *bmp;
  undefined8 in_stack_ffffffffffffffe8;
  int line;
  ALLEGRO_DISPLAY *in_stack_fffffffffffffff0;
  
  line = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if (in_RDI != (ALLEGRO_BITMAP *)0x0) {
    bmp = in_RDI;
    pAVar3 = al_get_target_bitmap();
    if (bmp == pAVar3) {
      in_stack_fffffffffffffff0 = al_get_current_display();
      if (in_stack_fffffffffffffff0 == (ALLEGRO_DISPLAY *)0x0) {
        al_set_target_bitmap((ALLEGRO_BITMAP *)disp);
      }
      else {
        al_get_backbuffer(in_stack_ffffffffffffffd8);
        al_set_target_bitmap((ALLEGRO_BITMAP *)disp);
      }
    }
    _al_set_bitmap_shader_field(bmp,(ALLEGRO_SHADER *)in_stack_ffffffffffffffd8);
    _al_unregister_destructor((_AL_DTOR_LIST *)bmp,(_AL_LIST_ITEM *)in_stack_ffffffffffffffd8);
    _Var1 = al_is_sub_bitmap(in_RDI);
    if (!_Var1) {
      vec = _al_get_bitmap_display(in_RDI);
      uVar2 = al_get_bitmap_flags(in_RDI);
      if ((uVar2 & 1) != 0) {
        destroy_memory_bitmap((ALLEGRO_BITMAP *)0x142a09);
        return;
      }
      if ((in_RDI->locked & 1U) != 0) {
        al_unlock_bitmap((ALLEGRO_BITMAP *)disp);
      }
      if (in_RDI->vt != (ALLEGRO_BITMAP_INTERFACE *)0x0) {
        (*in_RDI->vt->destroy_bitmap)(in_RDI);
      }
      if (vec != (ALLEGRO_DISPLAY *)0x0) {
        _al_vector_find_and_delete((_AL_VECTOR *)vec,bmp);
      }
      line = (int)((ulong)vec >> 0x20);
      if (in_RDI->memory != (uchar *)0x0) {
        al_free_with_context
                  (in_stack_fffffffffffffff0,line,(char *)bmp,(char *)in_stack_ffffffffffffffd8);
      }
    }
    al_free_with_context
              (in_stack_fffffffffffffff0,line,(char *)bmp,(char *)in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void al_destroy_bitmap(ALLEGRO_BITMAP *bitmap)
{
   if (!bitmap) {
      return;
   }

   /* As a convenience, implicitly untarget the bitmap on the calling thread
    * before it is destroyed, but maintain the current display.
    */
   if (bitmap == al_get_target_bitmap()) {
      ALLEGRO_DISPLAY *display = al_get_current_display();
      if (display)
         al_set_target_bitmap(al_get_backbuffer(display));
      else
         al_set_target_bitmap(NULL);
   }

   _al_set_bitmap_shader_field(bitmap, NULL);

   _al_unregister_destructor(_al_dtor_list, bitmap->dtor_item);

   if (!al_is_sub_bitmap(bitmap)) {
      ALLEGRO_DISPLAY* disp = _al_get_bitmap_display(bitmap);
      if (al_get_bitmap_flags(bitmap) & ALLEGRO_MEMORY_BITMAP) {
         destroy_memory_bitmap(bitmap);
         return;
      }

      /* Else it's a display bitmap */

      if (bitmap->locked)
         al_unlock_bitmap(bitmap);

      if (bitmap->vt)
         bitmap->vt->destroy_bitmap(bitmap);

      if (disp)
         _al_vector_find_and_delete(&disp->bitmaps, &bitmap);

      if (bitmap->memory)
         al_free(bitmap->memory);
   }

   al_free(bitmap);
}